

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O3

void __thiscall
soplex::
SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scale(SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lp,bool persistent)

{
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Real a;
  char cVar1;
  int iVar2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *epsilon_00;
  long lVar3;
  DataArray<int> *scaleExp;
  byte bVar4;
  char *pcVar5;
  DataArray<int> *coScaleExp;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vecset;
  SPxOut *pSVar6;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowratio;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  colratio;
  Verbosity local_62c;
  undefined8 local_628;
  uint auStack_620 [12];
  undefined5 uStack_5f0;
  undefined3 uStack_5eb;
  int iStack_5e8;
  undefined1 uStack_5e4;
  undefined8 local_5e0;
  cpp_dec_float<100U,_int,_void> local_5d8;
  cpp_dec_float<100U,_int,_void> local_588;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_498;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_350;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_300;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_260;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_210;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_170;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_120;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_80;
  
  pSVar6 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if ((pSVar6 != (SPxOut *)0x0) && (2 < (int)pSVar6->m_verbosity)) {
    local_5d8.data._M_elems[0] = 3;
    local_588.data._M_elems[0] = pSVar6->m_verbosity;
    (*pSVar6->_vptr_SPxOut[2])();
    pSVar6 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity],"Equilibrium scaling LP",0x16);
    pcVar5 = "";
    if (persistent) {
      pcVar5 = " (persistent)";
    }
    lVar3 = 0xd;
    if (!persistent) {
      lVar3 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity],pcVar5,lVar3);
    cVar1 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18) +
                    cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    pSVar6 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar6->_vptr_SPxOut[2])(pSVar6,&local_588);
  }
  (**(this->
     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     )._vptr_SPxScaler)(this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x33])(&local_588,this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x34])(&local_5d8,this,lp);
  this_00 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_00);
  local_5e0._0_4_ = cpp_dec_float_finite;
  local_5e0._4_4_ = 0x10;
  local_628._0_4_ = 0;
  local_628._4_4_ = 0;
  auStack_620[0] = 0;
  auStack_620[1] = 0;
  auStack_620[2] = 0;
  auStack_620[3] = 0;
  auStack_620[4] = 0;
  auStack_620[5] = 0;
  auStack_620[6] = 0;
  auStack_620[7] = 0;
  auStack_620[8] = 0;
  auStack_620[9] = 0;
  auStack_620[10] = 0;
  auStack_620[0xb] = 0;
  uStack_5f0 = 0;
  uStack_5eb = 0;
  iStack_5e8 = 0;
  uStack_5e4 = 0;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_628,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  bVar4 = 0;
  if ((local_588.fpclass != cpp_dec_float_NaN) &&
     (bVar4 = 0, local_5d8.fpclass != cpp_dec_float_NaN)) {
    iVar2 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&local_588,&local_5d8);
    bVar4 = (byte)((uint)iVar2 >> 0x1f);
  }
  pSVar6 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if ((pSVar6 != (SPxOut *)0x0) && (3 < (int)pSVar6->m_verbosity)) {
    local_62c = pSVar6->m_verbosity;
    (*pSVar6->_vptr_SPxOut[2])();
    pSVar6 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity],"before scaling:",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity]," min= ",6);
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(&local_80,lp,1);
    boost::multiprecision::operator<<(pSVar6->m_streams[pSVar6->m_verbosity],&local_80);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity]," max= ",6);
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(&local_d0,lp,1);
    boost::multiprecision::operator<<(pSVar6->m_streams[pSVar6->m_verbosity],&local_d0);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity]," col-ratio= ",0xc);
    local_3a8.m_backend.data._M_elems[1] = local_588.data._M_elems[1];
    local_3a8.m_backend.data._M_elems[0] = local_588.data._M_elems[0];
    local_3a8.m_backend.data._M_elems[2] = local_588.data._M_elems[2];
    local_3a8.m_backend.data._M_elems[3] = local_588.data._M_elems[3];
    local_3a8.m_backend.data._M_elems[4] = local_588.data._M_elems[4];
    local_3a8.m_backend.data._M_elems[5] = local_588.data._M_elems[5];
    local_3a8.m_backend.data._M_elems[6] = local_588.data._M_elems[6];
    local_3a8.m_backend.data._M_elems[7] = local_588.data._M_elems[7];
    local_3a8.m_backend.data._M_elems[8] = local_588.data._M_elems[8];
    local_3a8.m_backend.data._M_elems[9] = local_588.data._M_elems[9];
    local_3a8.m_backend.data._M_elems[10] = local_588.data._M_elems[10];
    local_3a8.m_backend.data._M_elems[0xb] = local_588.data._M_elems[0xb];
    local_3a8.m_backend.data._M_elems[0xc] = local_588.data._M_elems[0xc];
    local_3a8.m_backend.data._M_elems[0xd] = local_588.data._M_elems[0xd];
    local_3a8.m_backend.data._M_elems[0xe] = local_588.data._M_elems[0xe];
    local_3a8.m_backend.data._M_elems[0xf] = local_588.data._M_elems[0xf];
    local_3a8.m_backend.exp = local_588.exp;
    local_3a8.m_backend.neg = local_588.neg;
    boost::multiprecision::operator<<(pSVar6->m_streams[pSVar6->m_verbosity],&local_3a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity]," row-ratio= ",0xc);
    local_3f8.m_backend.data._M_elems[1] = local_5d8.data._M_elems[1];
    local_3f8.m_backend.data._M_elems[0] = local_5d8.data._M_elems[0];
    local_3f8.m_backend.data._M_elems[2] = local_5d8.data._M_elems[2];
    local_3f8.m_backend.data._M_elems[3] = local_5d8.data._M_elems[3];
    local_3f8.m_backend.data._M_elems[4] = local_5d8.data._M_elems[4];
    local_3f8.m_backend.data._M_elems[5] = local_5d8.data._M_elems[5];
    local_3f8.m_backend.data._M_elems[6] = local_5d8.data._M_elems[6];
    local_3f8.m_backend.data._M_elems[7] = local_5d8.data._M_elems[7];
    local_3f8.m_backend.data._M_elems[8] = local_5d8.data._M_elems[8];
    local_3f8.m_backend.data._M_elems[9] = local_5d8.data._M_elems[9];
    local_3f8.m_backend.data._M_elems[10] = local_5d8.data._M_elems[10];
    local_3f8.m_backend.data._M_elems[0xb] = local_5d8.data._M_elems[0xb];
    local_3f8.m_backend.data._M_elems[0xc] = local_5d8.data._M_elems[0xc];
    local_3f8.m_backend.data._M_elems[0xd] = local_5d8.data._M_elems[0xd];
    local_3f8.m_backend.data._M_elems[0xe] = local_5d8.data._M_elems[0xe];
    local_3f8.m_backend.data._M_elems[0xf] = local_5d8.data._M_elems[0xf];
    local_3f8.m_backend.exp = local_5d8.exp;
    local_3f8.m_backend.neg = local_5d8.neg;
    boost::multiprecision::operator<<(pSVar6->m_streams[pSVar6->m_verbosity],&local_3f8);
    cVar1 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18) +
                    cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    pSVar6 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar6->_vptr_SPxOut[2])(pSVar6,&local_62c);
  }
  if (bVar4 == 0) {
    local_4e8.m_backend.data._M_elems[0xf]._1_3_ = uStack_5eb;
    local_4e8.m_backend.data._M_elems._56_5_ = uStack_5f0;
    local_4e8.m_backend.data._M_elems[0xc] = auStack_620[10];
    local_4e8.m_backend.data._M_elems[0xd] = auStack_620[0xb];
    local_4e8.m_backend.data._M_elems[8] = auStack_620[6];
    local_4e8.m_backend.data._M_elems[9] = auStack_620[7];
    local_4e8.m_backend.data._M_elems[10] = auStack_620[8];
    local_4e8.m_backend.data._M_elems[0xb] = auStack_620[9];
    local_4e8.m_backend.data._M_elems[4] = auStack_620[2];
    local_4e8.m_backend.data._M_elems[5] = auStack_620[3];
    local_4e8.m_backend.data._M_elems[6] = auStack_620[4];
    local_4e8.m_backend.data._M_elems[7] = auStack_620[5];
    local_4e8.m_backend.data._M_elems[0] = (uint)local_628;
    local_4e8.m_backend.data._M_elems[1] = local_628._4_4_;
    local_4e8.m_backend.data._M_elems[2] = auStack_620[0];
    local_4e8.m_backend.data._M_elems[3] = auStack_620[1];
    local_4e8.m_backend.exp = iStack_5e8;
    local_4e8.m_backend.neg = (bool)uStack_5e4;
    local_4e8.m_backend.fpclass = (fpclass_type)local_5e0;
    local_4e8.m_backend.prec_elem = local_5e0._4_4_;
    computeEquiExpVec((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)lp,(this->
                            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).m_activeColscaleExp,
                      (this->
                      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_activeRowscaleExp,&local_4e8);
    if ((this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_doBoth != true) goto LAB_004476f7;
    vecset = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    scaleExp = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_activeColscaleExp;
    coScaleExp = (this->
                 super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_activeRowscaleExp;
    local_538.m_backend.data._M_elems[0xf]._1_3_ = uStack_5eb;
    local_538.m_backend.data._M_elems._56_5_ = uStack_5f0;
    epsilon_00 = &local_538;
    local_538.m_backend.data._M_elems[0xc] = auStack_620[10];
    local_538.m_backend.data._M_elems[0xd] = auStack_620[0xb];
    local_538.m_backend.data._M_elems[8] = auStack_620[6];
    local_538.m_backend.data._M_elems[9] = auStack_620[7];
    local_538.m_backend.data._M_elems[10] = auStack_620[8];
    local_538.m_backend.data._M_elems[0xb] = auStack_620[9];
    local_538.m_backend.data._M_elems[4] = auStack_620[2];
    local_538.m_backend.data._M_elems[5] = auStack_620[3];
    local_538.m_backend.data._M_elems[6] = auStack_620[4];
    local_538.m_backend.data._M_elems[7] = auStack_620[5];
    local_538.m_backend.data._M_elems[0] = (uint)local_628;
    local_538.m_backend.data._M_elems[1] = local_628._4_4_;
    local_538.m_backend.data._M_elems[2] = auStack_620[0];
    local_538.m_backend.data._M_elems[3] = auStack_620[1];
    local_538.m_backend.exp = iStack_5e8;
    local_538.m_backend.neg = (bool)uStack_5e4;
    local_538.m_backend.fpclass = (fpclass_type)local_5e0;
    local_538.m_backend.prec_elem = local_5e0._4_4_;
  }
  else {
    local_448.m_backend.data._M_elems[0xf]._1_3_ = uStack_5eb;
    local_448.m_backend.data._M_elems._56_5_ = uStack_5f0;
    local_448.m_backend.data._M_elems[0xc] = auStack_620[10];
    local_448.m_backend.data._M_elems[0xd] = auStack_620[0xb];
    local_448.m_backend.data._M_elems[8] = auStack_620[6];
    local_448.m_backend.data._M_elems[9] = auStack_620[7];
    local_448.m_backend.data._M_elems[10] = auStack_620[8];
    local_448.m_backend.data._M_elems[0xb] = auStack_620[9];
    local_448.m_backend.data._M_elems[4] = auStack_620[2];
    local_448.m_backend.data._M_elems[5] = auStack_620[3];
    local_448.m_backend.data._M_elems[6] = auStack_620[4];
    local_448.m_backend.data._M_elems[7] = auStack_620[5];
    local_448.m_backend.data._M_elems[0] = (uint)local_628;
    local_448.m_backend.data._M_elems[1] = local_628._4_4_;
    local_448.m_backend.data._M_elems[2] = auStack_620[0];
    local_448.m_backend.data._M_elems[3] = auStack_620[1];
    local_448.m_backend.exp = iStack_5e8;
    local_448.m_backend.neg = (bool)uStack_5e4;
    local_448.m_backend.fpclass = (fpclass_type)local_5e0;
    local_448.m_backend.prec_elem = local_5e0._4_4_;
    computeEquiExpVec(&(lp->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ,(this->
                       super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).m_activeRowscaleExp,
                      (this->
                      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_activeColscaleExp,&local_448);
    if ((this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_doBoth != true) goto LAB_004476f7;
    coScaleExp = (this->
                 super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_activeColscaleExp;
    scaleExp = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_activeRowscaleExp;
    local_498.m_backend.data._M_elems[0xf]._1_3_ = uStack_5eb;
    local_498.m_backend.data._M_elems._56_5_ = uStack_5f0;
    epsilon_00 = &local_498;
    local_498.m_backend.data._M_elems[0xc] = auStack_620[10];
    local_498.m_backend.data._M_elems[0xd] = auStack_620[0xb];
    local_498.m_backend.data._M_elems[8] = auStack_620[6];
    local_498.m_backend.data._M_elems[9] = auStack_620[7];
    local_498.m_backend.data._M_elems[10] = auStack_620[8];
    local_498.m_backend.data._M_elems[0xb] = auStack_620[9];
    local_498.m_backend.data._M_elems[4] = auStack_620[2];
    local_498.m_backend.data._M_elems[5] = auStack_620[3];
    local_498.m_backend.data._M_elems[6] = auStack_620[4];
    local_498.m_backend.data._M_elems[7] = auStack_620[5];
    local_498.m_backend.data._M_elems[0] = (uint)local_628;
    local_498.m_backend.data._M_elems[1] = local_628._4_4_;
    local_498.m_backend.data._M_elems[2] = auStack_620[0];
    local_498.m_backend.data._M_elems[3] = auStack_620[1];
    local_498.m_backend.exp = iStack_5e8;
    local_498.m_backend.neg = (bool)uStack_5e4;
    local_498.m_backend.fpclass = (fpclass_type)local_5e0;
    local_498.m_backend.prec_elem = local_5e0._4_4_;
    vecset = lp;
  }
  computeEquiExpVec((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)vecset,coScaleExp,scaleExp,epsilon_00);
LAB_004476f7:
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[2])(this,lp);
  pSVar6 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if (pSVar6 != (SPxOut *)0x0) {
    local_62c = pSVar6->m_verbosity;
    if (4 < (int)local_62c) {
      (*pSVar6->_vptr_SPxOut[2])();
      pSVar6 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity],"Row scaling min= ",0x11);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x31])(&local_120,this);
      boost::multiprecision::operator<<(pSVar6->m_streams[pSVar6->m_verbosity],&local_120);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity]," max= ",6);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x32])(&local_170,this);
      boost::multiprecision::operator<<(pSVar6->m_streams[pSVar6->m_verbosity],&local_170);
      cVar1 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18)
                      + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity],"Col scaling min= ",0x11);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x2f])(&local_1c0,this);
      boost::multiprecision::operator<<(pSVar6->m_streams[pSVar6->m_verbosity],&local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity]," max= ",6);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x30])(&local_210,this);
      boost::multiprecision::operator<<(pSVar6->m_streams[pSVar6->m_verbosity],&local_210);
      cVar1 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18)
                      + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      pSVar6 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar6->_vptr_SPxOut[2])(pSVar6,&local_62c);
      pSVar6 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      if (pSVar6 == (SPxOut *)0x0) {
        return;
      }
    }
    local_62c = pSVar6->m_verbosity;
    if (3 < (int)local_62c) {
      (*pSVar6->_vptr_SPxOut[2])();
      pSVar6 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity],"after scaling: ",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity]," min= ",6);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[3])(&local_260,lp,0);
      boost::multiprecision::operator<<(pSVar6->m_streams[pSVar6->m_verbosity],&local_260);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity]," max= ",6);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[4])(&local_2b0,lp,0);
      boost::multiprecision::operator<<(pSVar6->m_streams[pSVar6->m_verbosity],&local_2b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity]," col-ratio= ",0xc);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x33])(&local_300,this,lp);
      boost::multiprecision::operator<<(pSVar6->m_streams[pSVar6->m_verbosity],&local_300);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar6->m_streams[pSVar6->m_verbosity]," row-ratio= ",0xc);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x34])(&local_350,this,lp);
      boost::multiprecision::operator<<(pSVar6->m_streams[pSVar6->m_verbosity],&local_350);
      cVar1 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18)
                      + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      pSVar6 = (this->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar6->_vptr_SPxOut[2])(pSVar6,&local_62c);
    }
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Equilibrium scaling LP" <<
                 (persistent ? " (persistent)" : "") << std::endl;)

   this->setup(lp);

   /* We want to do the direction first, which has a lower maximal ratio,
    * since the lowest value in the scaled matrix is bounded from below by
    * the inverse of the maximum ratio of the direction that is done first
    * Example:
    *
    *                     Rowratio
    *            0.1  1   10
    *            10   1   10
    *
    * Colratio   100  1
    *
    * Row first =>         Col next =>
    *            0.1  1          0.1  1
    *            1    0.1        1    0.1
    *
    * Col first =>         Row next =>
    *            0.01 1          0.01 1
    *            1    1          1    1
    *
    */
   R colratio = this->maxColRatio(lp);
   R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   bool colFirst = colratio < rowratio;

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   if(colFirst)
   {
      computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);
   }
   else
   {
      computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);
   }

   /* scale */
   this->applyScaling(lp);

   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                 << " max= " << this->maxAbsRowscale()
                 << std::endl
                 << "Col scaling min= " << this->minAbsColscale()
                 << " max= " << this->maxAbsColscale()
                 << std::endl;)

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                 << " min= " << lp.minAbsNzo(false)
                 << " max= " << lp.maxAbsNzo(false)
                 << " col-ratio= " << this->maxColRatio(lp)
                 << " row-ratio= " << this->maxRowRatio(lp)
                 << std::endl;)

}